

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O2

UBool ultag_isUnicodeLocaleType_63(char *s,int32_t len)

{
  bool bVar1;
  UBool UVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  
  sVar4 = (size_t)(uint)len;
  if (len < 0) {
    sVar4 = strlen(s);
  }
  uVar5 = 0;
  do {
    if ((int)sVar4 < 1) {
      uVar3 = (uint)(2 < (int)uVar5);
LAB_002c351f:
      return (UBool)uVar3;
    }
    if (*s == '-') {
      uVar3 = 0;
      bVar1 = (int)uVar5 < 3;
      uVar5 = uVar3;
      if (bVar1) goto LAB_002c351f;
    }
    else {
      UVar2 = uprv_isASCIILetter_63(*s);
      if (UVar2 == '\0') {
        uVar3 = 0;
        if (((byte)(*s - 0x3aU) < 0xf6) || (uVar3 = 0, 7 < (int)uVar5)) goto LAB_002c351f;
      }
      else if (7 < (int)uVar5) {
        uVar3 = 0;
        goto LAB_002c351f;
      }
      uVar5 = uVar5 + 1;
    }
    s = s + 1;
    sVar4 = (size_t)((int)sVar4 - 1);
  } while( true );
}

Assistant:

U_CFUNC UBool
ultag_isUnicodeLocaleType(const char*s, int32_t len) {
    const char* p;
    int32_t subtagLen = 0;

    if (len < 0) {
        len = (int32_t)uprv_strlen(s);
    }

    for (p = s; len > 0; p++, len--) {
        if (*p == SEP) {
            if (subtagLen < 3) {
                return FALSE;
            }
            subtagLen = 0;
        } else if (ISALPHA(*p) || ISNUMERIC(*p)) {
            subtagLen++;
            if (subtagLen > 8) {
                return FALSE;
            }
        } else {
            return FALSE;
        }
    }

    return (subtagLen >= 3);
}